

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall dmlc::JSONWriter::EndObject(JSONWriter *this)

{
  value_type vVar1;
  bool bVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  reference pvVar5;
  size_t nelem;
  byte local_361;
  undefined1 local_360 [7];
  bool newline;
  uint local_1d4;
  size_type local_1d0;
  LogCheckError local_1c8;
  LogCheckError _check_err_1;
  uint local_24;
  size_type local_20;
  LogCheckError local_18;
  LogCheckError _check_err;
  JSONWriter *this_local;
  
  _check_err.str = (string *)this;
  local_20 = std::vector<bool,_std::allocator<bool>_>::size(&this->scope_multi_line_);
  local_24 = 0;
  LogCheck_NE<unsigned_long,unsigned_int>((dmlc *)&local_18,&local_20,&local_24);
  bVar2 = LogCheckError::operator_cast_to_bool(&local_18);
  if (bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&_check_err_1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,899);
    poVar3 = LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&_check_err_1);
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: ");
    poVar4 = std::operator<<(poVar4,"scope_multi_line_.size() != 0U");
    poVar4 = std::operator<<(poVar4,(string *)local_18.str);
    std::operator<<(poVar4,": ");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&_check_err_1);
  }
  LogCheckError::~LogCheckError(&local_18);
  local_1d0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->scope_counter_);
  local_1d4 = 0;
  LogCheck_NE<unsigned_long,unsigned_int>((dmlc *)&local_1c8,&local_1d0,&local_1d4);
  bVar2 = LogCheckError::operator_cast_to_bool(&local_1c8);
  if (bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_360,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,900);
    poVar3 = LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)local_360);
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: ");
    poVar4 = std::operator<<(poVar4,"scope_counter_.size() != 0U");
    poVar4 = std::operator<<(poVar4,(string *)local_1c8.str);
    std::operator<<(poVar4,": ");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_360);
  }
  LogCheckError::~LogCheckError(&local_1c8);
  _nelem = std::vector<bool,_std::allocator<bool>_>::back(&this->scope_multi_line_);
  local_361 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&nelem);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->scope_counter_);
  vVar1 = *pvVar5;
  std::vector<bool,_std::allocator<bool>_>::pop_back(&this->scope_multi_line_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->scope_counter_);
  if (((local_361 & 1) != 0) && (vVar1 != 0)) {
    WriteSeperator(this);
  }
  anon_unknown_9::Extend<char>(this->os_,'}');
  return;
}

Assistant:

inline void JSONWriter::EndObject() {
  CHECK_NE(scope_multi_line_.size(), 0U);
  CHECK_NE(scope_counter_.size(), 0U);
  bool newline = scope_multi_line_.back();
  size_t nelem = scope_counter_.back();
  scope_multi_line_.pop_back();
  scope_counter_.pop_back();
  if (newline && nelem != 0)
    WriteSeperator();
  Extend(os_, '}');
}